

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckExtraSpaces.cxx
# Opt level: O0

bool __thiscall kws::Parser::CheckExtraSpaces(Parser *this,unsigned_long max,bool checkEmptyLines)

{
  char *pcVar1;
  value_type *__x;
  byte in_DL;
  ulong in_RSI;
  long in_RDI;
  char localval [21];
  size_t length_1;
  Error error;
  unsigned_long space;
  long i;
  bool empty;
  long pos;
  bool checking;
  long posEndOfLine;
  bool hasError;
  char *val;
  size_t length;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  char *pos_00;
  Parser *in_stack_ffffffffffffff38;
  string local_80 [32];
  ulong local_60;
  long local_58;
  byte local_49;
  long local_48;
  byte local_39;
  long local_38;
  byte local_29;
  char *local_28;
  undefined8 local_20;
  byte local_11;
  ulong local_10;
  
  local_11 = in_DL & 1;
  *(undefined1 *)(in_RDI + 0x3b) = 1;
  local_20 = 0xff;
  local_10 = in_RSI;
  local_28 = (char *)operator_new__(0xff);
  snprintf(local_28,0xff,"Spaces at the end of line = %ld max spaces",local_10);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x1b8),local_28);
  pos_00 = local_28;
  if (local_28 != (char *)0x0) {
    operator_delete__(local_28);
  }
  local_29 = 0;
  local_38 = std::__cxx11::string::find((char *)(in_RDI + 0x4f8),0x1d8c29);
  do {
    if (local_38 == -1) {
      return (bool)((local_29 ^ 0xff) & 1);
    }
    local_39 = 1;
    if ((local_11 & 1) == 0) {
      local_49 = 1;
      local_48 = local_38;
      do {
        local_48 = local_48 + -1;
        in_stack_ffffffffffffff27 = false;
        if (0 < local_48) {
          pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
          in_stack_ffffffffffffff27 = *pcVar1 != '\n';
        }
        if ((bool)in_stack_ffffffffffffff27 == false) goto LAB_001b45d0;
        pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8);
      } while (*pcVar1 == ' ');
      local_49 = 0;
LAB_001b45d0:
      if ((local_49 & 1) != 0) {
        local_39 = 0;
      }
    }
    if ((local_39 & 1) != 0) {
      local_60 = 0;
      local_58 = local_38;
      do {
        local_58 = local_58 + -1;
        if ((local_58 < 0) ||
           (pcVar1 = (char *)std::__cxx11::string::operator[](in_RDI + 0x4f8), *pcVar1 != ' '))
        goto LAB_001b47bc;
        local_60 = local_60 + 1;
      } while (local_60 <= local_10);
      ErrorStruct::ErrorStruct((ErrorStruct *)0x1b467a);
      __x = (value_type *)
            GetLineNumber(in_stack_ffffffffffffff38,(size_t)pos_00,SUB81((ulong)in_RDI >> 0x38,0));
      std::__cxx11::string::operator=(local_80,"Number of spaces before end of line exceed: ");
      snprintf(&stack0xffffffffffffff38,0x15,"%ld",local_60);
      std::__cxx11::string::operator+=(local_80,&stack0xffffffffffffff38);
      std::__cxx11::string::operator+=(local_80," (max=");
      snprintf(&stack0xffffffffffffff38,0x15,"%ld",local_10);
      std::__cxx11::string::operator+=(local_80,&stack0xffffffffffffff38);
      std::__cxx11::string::operator+=(local_80,")");
      std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),__x);
      local_29 = 1;
      ErrorStruct::~ErrorStruct((ErrorStruct *)0x1b4781);
    }
LAB_001b47bc:
    local_38 = std::__cxx11::string::find((char *)(in_RDI + 0x4f8),0x1d8c29);
  } while( true );
}

Assistant:

bool Parser::CheckExtraSpaces(unsigned long max,bool checkEmptyLines)
{
  m_TestsDone[SPACES] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Spaces at the end of line = %ld max spaces",max);
  m_TestsDescription[SPACES] = val;
  delete [] val;

  bool hasError = false;
  auto posEndOfLine = static_cast<long int>(m_Buffer.find("\r\n", 0));
  while(posEndOfLine != -1)
    {
    bool checking = true;
    if(!checkEmptyLines)
      {
      // Check if the line is empty
      long pos = posEndOfLine-1;
      bool empty = true;
      while(pos>0 && m_Buffer[pos]!='\n')
        {
        if(m_Buffer[pos] != ' ')
          {
          empty = false;
          break;
          }
        pos--;
        }

      if(empty)
        {
        checking = false;
        }
      }

     if(checking)
     {
      // We try to find the word before that
      long i=posEndOfLine-1;
      unsigned long space = 0;
      while(i>=0)
        {
        if(m_Buffer[i] == ' ')
          {
          space++;
          if(space > max)
            {
            Error error;
            error.line = this->GetLineNumber(posEndOfLine);
            error.line2 = error.line;
            error.number = SPACES;
            error.description = "Number of spaces before end of line exceed: ";
            constexpr size_t length = 21;
            char localval[length];
            snprintf(localval,length,"%ld",space);
            error.description += localval;
            error.description += " (max=";
            snprintf(localval,length,"%ld",max);
            error.description += localval;
            error.description += ")";
            m_ErrorList.push_back(error);
            hasError = true;
            break; // avoid multiple error line
            }
          }
        else
          {
          break;
          }
        i--;
        }
      }
    posEndOfLine = static_cast<long int>(m_Buffer.find("\r\n",posEndOfLine+1));
    }

  return !hasError;
}